

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O0

Optional<llvm::DWARFFormValue> * __thiscall
llvm::DWARFDie::find
          (Optional<llvm::DWARFFormValue> *__return_storage_ptr__,DWARFDie *this,Attribute Attr)

{
  bool bVar1;
  DWARFAbbreviationDeclaration *this_00;
  uint64_t DIEOffset;
  DWARFAbbreviationDeclaration *AbbrevDecl;
  Attribute Attr_local;
  DWARFDie *this_local;
  
  bVar1 = isValid(this);
  if (bVar1) {
    this_00 = getAbbreviationDeclarationPtr(this);
    if (this_00 == (DWARFAbbreviationDeclaration *)0x0) {
      Optional<llvm::DWARFFormValue>::Optional(__return_storage_ptr__,None);
    }
    else {
      DIEOffset = getOffset(this);
      DWARFAbbreviationDeclaration::getAttributeValue
                (__return_storage_ptr__,this_00,DIEOffset,Attr,this->U);
    }
  }
  else {
    Optional<llvm::DWARFFormValue>::Optional(__return_storage_ptr__,None);
  }
  return __return_storage_ptr__;
}

Assistant:

Optional<DWARFFormValue> DWARFDie::find(dwarf::Attribute Attr) const {
  if (!isValid())
    return None;
  auto AbbrevDecl = getAbbreviationDeclarationPtr();
  if (AbbrevDecl)
    return AbbrevDecl->getAttributeValue(getOffset(), Attr, *U);
  return None;
}